

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int CVmObjFile::s_getp_open_text(vm_val_t *retval,uint *in_argc,int is_resource_file,vm_rcdesc *rc)

{
  char *pcVar1;
  CVmHostIfc *pCVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  undefined8 *puVar5;
  long *plVar6;
  vm_val_t *this;
  size_t sVar7;
  undefined4 extraout_var;
  void *pvVar8;
  int in_EDX;
  int *in_RSI;
  CVmNetFile *in_RDI;
  long res_end;
  long res_start;
  unsigned_long res_len;
  osfildef *fp;
  CVmDataSource *ds;
  vm_obj_id_t cset_obj;
  int create_readbuf;
  err_frame_t err_cur__;
  CVmNetFile *netfile;
  int access;
  uint argc;
  undefined4 in_stack_fffffffffffffe38;
  os_filetype_t in_stack_fffffffffffffe3c;
  os_filetype_t in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  osfildef *in_stack_fffffffffffffe48;
  CVmRun *in_stack_fffffffffffffe50;
  undefined8 uVar9;
  void *in_stack_fffffffffffffe60;
  void *in_stack_fffffffffffffe70;
  int local_15c;
  undefined1 local_148 [8];
  FILE *local_140;
  void *local_138;
  vm_obj_id_t local_130;
  undefined4 local_12c;
  uint local_128 [2];
  undefined8 local_120;
  void *local_118;
  __jmp_buf_tag _Stack_110;
  CVmNetFile *local_48;
  undefined4 local_40;
  int local_2c;
  int local_1c;
  CVmNetFile *local_10;
  
  if (in_RSI == (int *)0x0) {
    local_15c = 0;
  }
  else {
    local_15c = *in_RSI;
  }
  local_2c = local_15c;
  local_1c = in_EDX;
  local_10 = in_RDI;
  if ((s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::desc_file == '\0') &&
     (iVar3 = __cxa_guard_acquire(&s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::
                                   desc_file), iVar3 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_open_text::desc_file,2,1);
    __cxa_guard_release(&s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::desc_file);
  }
  if ((s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::desc_res == '\0') &&
     (iVar3 = __cxa_guard_acquire(&s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::
                                   desc_res), iVar3 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_open_text::desc_res,1,1);
    __cxa_guard_release(&s_getp_open_text(vm_val_t*,unsigned_int*,int,vm_rcdesc_const*)::desc_res);
  }
  iVar3 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_fffffffffffffe48,
                     (uint *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (iVar3 == 0) {
    local_40 = 0;
    local_48 = get_filename_and_access
                         ((vm_rcdesc *)in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->_flags,
                          in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                          (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    local_120 = *puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)local_128;
    local_128[0] = _setjmp(&_Stack_110);
    if (local_128[0] == 0) {
      local_12c = 0;
      local_130 = get_charset_arg((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                  (int)in_stack_fffffffffffffe70);
      this = CVmStack::push();
      vm_val_t::set_obj(this,local_130);
      pCVar2 = G_host_ifc_X;
      local_138 = (void *)0x0;
      local_140 = (FILE *)0x0;
      switch(local_40) {
      case 1:
        if (local_1c == 0) {
          local_140 = fopen(local_48->lclfname,"rb");
          if (local_140 != (FILE *)0x0) {
            pvVar8 = operator_new(0x10);
            CVmFileSource::CVmFileSource
                      ((CVmFileSource *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (osfildef *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            local_138 = pvVar8;
          }
        }
        else {
          pcVar1 = local_48->lclfname;
          sVar7 = strlen(local_48->lclfname);
          iVar3 = (*pCVar2->_vptr_CVmHostIfc[0xe])(pCVar2,pcVar1,sVar7,local_148);
          local_140 = (FILE *)CONCAT44(extraout_var,iVar3);
          if (local_140 != (FILE *)0x0) {
            ftell(local_140);
            pvVar8 = operator_new(0x20);
            CVmResFileSource::CVmResFileSource
                      ((CVmResFileSource *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            local_138 = pvVar8;
          }
        }
        if (local_140 == (FILE *)0x0) {
          CVmRun::throw_new_class
                    (in_stack_fffffffffffffe50,
                     (vm_obj_id_t)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (uint)in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        }
        vVar4 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffe50 >> 0x20);
        local_12c = 1;
        break;
      case 2:
        local_140 = fopen(local_48->lclfname,"wb");
        if (local_140 == (FILE *)0x0) {
          CVmRun::throw_new_class
                    (in_stack_fffffffffffffe50,
                     (vm_obj_id_t)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (uint)in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        }
        vVar4 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffe50 >> 0x20);
        in_stack_fffffffffffffe70 = operator_new(0x10);
        CVmFileSource::CVmFileSource
                  ((CVmFileSource *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (osfildef *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_138 = in_stack_fffffffffffffe70;
        break;
      case 3:
        local_140 = (FILE *)osfoprwb((char *)CONCAT44(in_stack_fffffffffffffe44,
                                                      in_stack_fffffffffffffe40),
                                     in_stack_fffffffffffffe3c);
        if (local_140 == (FILE *)0x0) {
          CVmRun::throw_new_class
                    (in_stack_fffffffffffffe50,
                     (vm_obj_id_t)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (uint)in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        }
        vVar4 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffe50 >> 0x20);
        pvVar8 = operator_new(0x10);
        CVmFileSource::CVmFileSource
                  ((CVmFileSource *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (osfildef *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_12c = 1;
        local_138 = pvVar8;
        break;
      case 4:
        local_140 = fopen(local_48->lclfname,"w+b");
        if (local_140 == (FILE *)0x0) {
          CVmRun::throw_new_class
                    (in_stack_fffffffffffffe50,
                     (vm_obj_id_t)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (uint)in_stack_fffffffffffffe48,
                     (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        }
        vVar4 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffe50 >> 0x20);
        in_stack_fffffffffffffe60 = operator_new(0x10);
        CVmFileSource::CVmFileSource
                  ((CVmFileSource *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (osfildef *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_12c = 1;
        local_138 = in_stack_fffffffffffffe60;
        break;
      default:
        local_140 = (FILE *)0x0;
        err_throw(0);
      }
      vVar4 = create((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),local_10,vVar4,
                     (CVmDataSource *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                     in_stack_fffffffffffffe40,(int)in_stack_fffffffffffffe70);
      vm_val_t::set_obj((vm_val_t *)local_10,vVar4);
      local_48 = (CVmNetFile *)0x0;
      CVmStack::discard(local_2c + 1);
    }
    if (((local_128[0] & 0x8000) == 0) &&
       (local_128[0] = local_128[0] | 0x8000, local_48 != (CVmNetFile *)0x0)) {
      CVmNetFile::abandon((CVmNetFile *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    }
    uVar9 = local_120;
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = uVar9;
    if ((local_128[0] & 0x4001) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pvVar8 = local_118;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar6 + 0x10) = pvVar8;
      err_rethrow();
    }
    if ((local_128[0] & 2) != 0) {
      free(local_118);
    }
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_open_text(VMG_ vm_val_t *retval, uint *in_argc,
                                 int is_resource_file, const vm_rcdesc *rc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc_file(2, 1);
    static CVmNativeCodeDesc desc_res(1, 1);
    if (get_prop_check_argc(retval, in_argc,
                            is_resource_file ? &desc_res : &desc_file))
        return TRUE;

    /* 
     *   retrieve the filename and access mode arguments, and set up network
     *   storage server access if applicable 
     */
    int access = 0;
    CVmNetFile *netfile = get_filename_and_access(
        vmg_ rc, &access, is_resource_file, OSFTTEXT, "text/plain");

    err_try
    {
        /* presume we won't need a read buffer */
        int create_readbuf = FALSE;

        /* retrieve the character set object */
        vm_obj_id_t cset_obj = get_charset_arg(vmg_ 2, argc);

        /* push the character map object onto the stack for gc protection */
        G_stk->push()->set_obj(cset_obj);
        
        /* open the file for reading or writing, as appropriate */
        CVmDataSource *ds = 0;
        osfildef *fp = 0;
        switch(access)
        {
        case VMOBJFILE_ACCESS_READ:
            /* open a resource file or file system file, as appropriate */
            if (is_resource_file)
            {
                /* it's a resource - open it */
                unsigned long res_len;
                fp = G_host_ifc->find_resource(
                    netfile->lclfname, strlen(netfile->lclfname), &res_len);
                
                /* 
                 *   if we found the resource, note the start and end seek
                 *   positions, so we can limit reading of the underlying
                 *   file to the section that contains the resource data 
                 */
                if (fp != 0)
                {
                    /* 
                     *   find_resource() handed us back a file handle
                     *   positioned at the start of the resource data stream,
                     *   possibly within a larger file; note the current
                     *   offset as the starting offset in case we need to
                     *   seek within the resource later 
                     */
                    long res_start = osfpos(fp);
                    
                    /* 
                     *   note where the resource ends - it might be embedded
                     *   within a larger file, so we need to limit reading to
                     *   the extent from the resource map 
                     */
                    long res_end = res_start + res_len;
                    
                    /* create the data source */
                    ds = new CVmResFileSource(fp, res_start, res_end);
                }
            }
            else
            {
                /* 
                 *   It's not a resource - open an ordinary text file for
                 *   reading.  Even though we're going to treat the file as a
                 *   text file, open it in binary mode, since we'll do our
                 *   own universal newline translations; this allows us to
                 *   work with files in any character set, and using almost
                 *   any newline conventions, so files copied from other
                 *   systems will be fully usable even if they haven't been
                 *   fixed up to local conventions.  
                 */
                fp = osfoprb(netfile->lclfname, OSFTTEXT);

                /* if that worked, create the data source */
                if (fp != 0)
                    ds = new CVmFileSource(fp);
            }
            
            /* make sure we opened it successfully */
            if (fp == 0)
                G_interpreter->throw_new_class(
                    vmg_ G_predef->file_not_found_exc,
                    0, "file not found");

            /* we need a read buffer */
            create_readbuf = TRUE;
            break;
            
        case VMOBJFILE_ACCESS_WRITE:
            /* open for writing */
            fp = osfopwb(netfile->lclfname, OSFTTEXT);
            
            /* make sure we created it successfully */
            if (fp == 0)
                G_interpreter->throw_new_class(
                    vmg_ G_predef->file_creation_exc,
                    0, "error creating file");

            /* create the data source */
            ds = new CVmFileSource(fp);
            break;

        case VMOBJFILE_ACCESS_RW_KEEP:
            /* open for read/write, keeping existing contents */
            fp = osfoprwb(netfile->lclfname, OSFTTEXT);
            
            /* make sure we were able to find or create the file */
            if (fp == 0)
                G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                               0, "error opening file");
            
            /* create the data source */
            ds = new CVmFileSource(fp);

            /* we need a read buffer */
            create_readbuf = TRUE;
            break;
            
        case VMOBJFILE_ACCESS_RW_TRUNC:
            /* open for read/write, truncating existing contents */
            fp = osfoprwtb(netfile->lclfname, OSFTTEXT);
            
            /* make sure we were successful */
            if (fp == 0)
                G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                               0, "error opening file");
            
            /* create the data source */
            ds = new CVmFileSource(fp);

            /* we need a read buffer */
            create_readbuf = TRUE;
            break;
            
        default:
            /* invalid access mode */
            fp = 0;
            err_throw(VMERR_BAD_VAL_BIF);
        }
        
        /* create our file object */
        retval->set_obj(create(vmg_ FALSE, netfile, cset_obj, ds,
                               VMOBJFILE_MODE_TEXT, access, create_readbuf));

        /* 
         *   the network file descriptor is stored in the File object now, so
         *   we no longer need to delete it 
         */
        netfile = 0;

        /* discard arguments and gc protection */
        G_stk->discard(argc + 1);
    }